

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_slic_marker.cpp
# Opt level: O3

void __thiscall ms_slic_marker_t::~ms_slic_marker_t(ms_slic_marker_t *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__ms_slic_marker_t_002b1f20;
  pcVar1 = (this->m_signature)._M_dataplus._M_p;
  paVar2 = &(this->m_signature).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_reserved)._M_dataplus._M_p;
  paVar2 = &(this->m_reserved).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_oem_table_id)._M_dataplus._M_p;
  paVar2 = &(this->m_oem_table_id).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_oem_id)._M_dataplus._M_p;
  paVar2 = &(this->m_oem_id).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

ms_slic_marker_t::~ms_slic_marker_t() {
    _clean_up();
}